

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<float,true>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  Var pvVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  
  pfVar4 = (float *)this->buffer;
  uVar2 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  uVar3 = this->byteOffset;
  uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar7 < (ulong)uVar3 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar6) {
LAB_00c04049:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  else {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  lVar12 = 0;
  fVar1 = *pfVar4;
LAB_00c03f13:
  do {
    fVar14 = fVar1;
    lVar11 = lVar12 * 4;
    lVar13 = lVar12;
    do {
      while( true ) {
        lVar11 = lVar11 + 4;
        lVar12 = lVar13 + 1;
        if (lVar12 - (ulong)uVar2 == 1) {
          pvVar10 = JavascriptNumber::ToVarNoCheck((double)fVar14,scriptContext);
          return pvVar10;
        }
        uVar3 = this->byteOffset;
        uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x71])();
        if ((ulong)uVar7 < (ulong)uVar3 + lVar11) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x9ec,
                                      "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                      ,
                                      "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                     );
          if (!bVar6) goto LAB_00c04049;
          *puVar9 = 0;
        }
        fVar1 = pfVar4[lVar13];
        BVar8 = JavascriptNumber::IsNan((double)fVar1);
        if (BVar8 != 0) {
          return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nan.ptr;
        }
        lVar13 = lVar12;
        if (findMax) break;
        if ((fVar1 < fVar14) ||
           (((fVar1 == 0.0 && (!NAN(fVar1))) &&
            (BVar8 = JavascriptNumber::IsNegZero((double)fVar14), BVar8 != 0)))) goto LAB_00c03f13;
      }
    } while (fVar1 <= fVar14);
  } while( true );
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }